

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_DRAIN_STAT(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  wchar_t flag_00;
  uint32_t uVar2;
  char *pcVar3;
  char local_48 [8];
  char dam_text [32];
  wchar_t dam;
  _Bool athletics;
  _Bool clarity;
  wchar_t wStack_1c;
  _Bool sust;
  wchar_t flag;
  wchar_t stat;
  effect_handler_context_t_conflict *context_local;
  
  wStack_1c = context->subtype;
  flag_00 = sustain_flag(wStack_1c);
  dam_text[0x1f] = player_of_has(player,flag_00);
  dam_text[0x1e] =
       flag_has_dbg((player->state).pflags,10,0x49,"player->state.pflags","(PF_CLARITY)");
  dam_text[0x1d] =
       flag_has_dbg((player->state).pflags,10,0x48,"player->state.pflags","(PF_ATHLETICS)");
  if (flag_00 < L'\0') {
    context_local._7_1_ = false;
  }
  else {
    context->ident = true;
    if (wStack_1c < L'\0') {
      wStack_1c = Rand_div(5);
    }
    if ((((dam_text[0x1e] & 1U) != 0) && (uVar2 = Rand_div(2), uVar2 == 0)) &&
       ((wStack_1c == L'\x01' || (wStack_1c == L'\x02')))) {
      dam_text[0x1f] = '\x01';
    }
    if ((((dam_text[0x1d] & 1U) != 0) && (uVar2 = Rand_div(2), uVar2 == 0)) &&
       ((wStack_1c == L'\x03' || (wStack_1c == L'\x04')))) {
      dam_text[0x1f] = '\x01';
    }
    if ((dam_text[0x1f] & 1U) == 0) {
      _Var1 = player_stat_dec(player,wStack_1c,false);
      if (_Var1) {
        dam_text._24_4_ = effect_calculate_value(context,false);
        memset(local_48,0,0x20);
        dam_text._24_4_ = player_apply_damage_reduction(player,dam_text._24_4_);
        equip_learn_flag(player,flag_00);
        if ((0 < (int)dam_text._24_4_) && (((player->opts).opt[3] & 1U) != 0)) {
          strnfmt(local_48,0x20," (%d)",(ulong)(uint)dam_text._24_4_);
        }
        pcVar3 = desc_stat(wStack_1c,false);
        msgt(0x99,"You feel very %s.%s",pcVar3,local_48);
        take_hit(player,dam_text._24_4_,"stat drain");
      }
      context_local._7_1_ = true;
    }
    else {
      equip_learn_flag(player,flag_00);
      pcVar3 = desc_stat(wStack_1c,false);
      msg("You feel very %s for a moment, but the feeling passes.",pcVar3);
      context_local._7_1_ = true;
    }
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_DRAIN_STAT(effect_handler_context_t *context)
{
	int stat = context->subtype;
	int flag = sustain_flag(stat);
	bool sust = player_of_has(player, flag);
	bool clarity = player_has(player, PF_CLARITY);
	bool athletics = player_has(player, PF_ATHLETICS);

	/* Bounds check */
	if (flag < 0) return false;

	/* ID */
	context->ident = true;

	/* Pick a random stat if needed */
	if (stat < 0) {
		stat = randint0(STAT_MAX);
	}

	/* Check for specialty ability partial sustains */
	if (clarity && one_in_(2) && ((stat == STAT_INT) || (stat == STAT_WIS))) {
		sust = true;
	}
	if (athletics && one_in_(2) && ((stat == STAT_DEX) || (stat == STAT_CON))) {
		sust = true;
	}

	/* Sustain */
	if (sust) {
		/* Notice effect */
		equip_learn_flag(player, flag);

		/* Message */
		msg("You feel very %s for a moment, but the feeling passes.",
				   desc_stat(stat, false));

		return (true);
	}

	/* Attempt to reduce the stat */
	if (player_stat_dec(player, stat, false)) {
		int dam = effect_calculate_value(context, false);
		char dam_text[32] = "";

		dam = player_apply_damage_reduction(player, dam);

		/* Notice effect */
		equip_learn_flag(player, flag);

		/* Message */
		if (dam > 0 && OPT(player, show_damage)) {
			strnfmt(dam_text, sizeof(dam_text), " (%d)", dam);
		}
		msgt(MSG_DRAIN_STAT, "You feel very %s.%s",
			desc_stat(stat, false), dam_text);
		take_hit(player, dam, "stat drain");
	}

	return (true);
}